

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  _Bool _Var1;
  CURLcode CVar2;
  Curl_cfilter *cf;
  ssl_config_data *psVar3;
  uint uVar4;
  Curl_easy *data;
  bool bVar5;
  _Bool added;
  void *old_ssl_sessionid;
  _Bool local_31;
  SSL_SESSION *local_30;
  
  bVar5 = false;
  cf = (Curl_cfilter *)SSL_get_ex_data((SSL *)ssl,0);
  if (cf != (Curl_cfilter *)0x0) {
    bVar5 = cf->ctx != (void *)0x0;
  }
  if (cf == (Curl_cfilter *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = (Curl_easy *)0x0;
    if (bVar5) {
      data = *(Curl_easy **)((long)cf->ctx + 0x38);
    }
  }
  uVar4 = 0;
  if ((cf != (Curl_cfilter *)0x0) && (uVar4 = 0, data != (Curl_easy *)0x0)) {
    _Var1 = Curl_ssl_cf_is_proxy(cf);
    psVar3 = Curl_ssl_cf_get_config(cf,data);
    if (((psVar3->primary).field_0x69 & 8) != 0) {
      local_31 = false;
      local_30 = (SSL_SESSION *)0x0;
      Curl_ssl_sessionid_lock(data);
      if (_Var1) {
        bVar5 = false;
      }
      else {
        _Var1 = Curl_ssl_getsessionid(cf,data,&local_30,(size_t *)0x0);
        bVar5 = !_Var1;
      }
      if ((bVar5) && (local_30 != ssl_sessionid)) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"old SSL session ID is stale, removing");
        }
        Curl_ssl_delsessionid(data,local_30);
        bVar5 = false;
      }
      uVar4 = 0;
      if (!bVar5) {
        uVar4 = 0;
        CVar2 = Curl_ssl_addsessionid(cf,data,ssl_sessionid,0,&local_31);
        if (CVar2 == CURLE_OK) {
          uVar4 = (uint)local_31;
        }
        else {
          Curl_failf(data,"failed to store ssl session");
        }
      }
      Curl_ssl_sessionid_unlock(data);
    }
  }
  return uVar4;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  int res = 0;
  struct Curl_easy *data;
  struct Curl_cfilter *cf;
  const struct ssl_config_data *config;
  struct ssl_connect_data *connssl;
  bool isproxy;

  cf = (struct Curl_cfilter*) SSL_get_app_data(ssl);
  connssl = cf? cf->ctx : NULL;
  data = connssl? CF_DATA_CURRENT(cf) : NULL;
  /* The sockindex has been stored as a pointer to an array element */
  if(!cf || !data)
    return 0;

  isproxy = Curl_ssl_cf_is_proxy(cf);

  config = Curl_ssl_cf_get_config(cf, data);
  if(config->primary.sessionid) {
    bool incache;
    bool added = FALSE;
    void *old_ssl_sessionid = NULL;

    Curl_ssl_sessionid_lock(data);
    if(isproxy)
      incache = FALSE;
    else
      incache = !(Curl_ssl_getsessionid(cf, data, &old_ssl_sessionid, NULL));
    if(incache) {
      if(old_ssl_sessionid != ssl_sessionid) {
        infof(data, "old SSL session ID is stale, removing");
        Curl_ssl_delsessionid(data, old_ssl_sessionid);
        incache = FALSE;
      }
    }

    if(!incache) {
      if(!Curl_ssl_addsessionid(cf, data, ssl_sessionid,
                                0 /* unknown size */, &added)) {
        if(added) {
          /* the session has been put into the session cache */
          res = 1;
        }
      }
      else
        failf(data, "failed to store ssl session");
    }
    Curl_ssl_sessionid_unlock(data);
  }

  return res;
}